

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

void __thiscall jsonip::detail::struct_helper<A>::struct_helper(struct_helper<A> *this)

{
  _Rb_tree_header *p_Var1;
  pair<const_char_*,_const_jsonip::detail::struct_helper_base::member_accessor_*> local_30;
  
  p_Var1 = &(this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_struct_helper_base).super_helper._vptr_helper =
       (_func_int **)&PTR__struct_helper_base_00113b80;
  local_30.second =
       struct_helper_base::member_accessor_impl<A,_mpl_::integral_c<int,_0>_>::instance();
  local_30.first = "a";
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,jsonip::detail::struct_helper_base::member_accessor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,jsonip::detail::struct_helper_base::member_accessor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsonip::detail::struct_helper_base::member_accessor_const*>>>
  ::
  _M_emplace_unique<std::pair<char_const*,jsonip::detail::struct_helper_base::member_accessor_const*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,jsonip::detail::struct_helper_base::member_accessor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,jsonip::detail::struct_helper_base::member_accessor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsonip::detail::struct_helper_base::member_accessor_const*>>>
              *)&(this->super_struct_helper_base).accessors,&local_30);
  return;
}

Assistant:

struct_helper()
        {
            boost::mpl::for_each<range_t>(initializer(*this));
        }